

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O3

void QtDebugUtils::formatQEnum<QSwipeGesture::SwipeDirection>(QDebug *debug,SwipeDirection value)

{
  char *pcVar1;
  QTextStream *this;
  long lVar2;
  storage_type *psVar3;
  Stream *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined1 local_50 [16];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::indexOfEnumerator((char *)&QSwipeGesture::staticMetaObject);
  local_50 = QMetaObject::enumerator(0x7e6460);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_50);
  this = (QTextStream *)debug->stream;
  if (lVar2 == 0) {
    QTextStream::operator<<(this,value);
    this_00 = debug->stream;
    if (this_00[0x30] != (Stream)0x1) goto LAB_002ce434;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar3 + lVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(this,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    this_00 = debug->stream;
    if (this_00[0x30] == (Stream)0x0) goto LAB_002ce434;
  }
  QTextStream::operator<<((QTextStream *)this_00,' ');
LAB_002ce434:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}